

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vanilla_date.cpp
# Opt level: O2

bool cornelich::parse_date(string *date,day_point *dp)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  pointer pcVar1;
  bool bVar2;
  day_point dVar3;
  int d;
  int m;
  int y;
  year_month_day ymd;
  int local_20;
  uint local_1c;
  uint local_18;
  year_month_day local_14;
  
  local_18 = 0;
  local_1c = 0;
  local_20 = 0;
  begin._M_current = (date->_M_dataplus)._M_p;
  bVar2 = util::parse_number<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                    (begin,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(begin._M_current + 4),(int *)&local_18);
  if (((bVar2) &&
      (pcVar1 = (date->_M_dataplus)._M_p,
      bVar2 = util::parse_number<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(pcVar1 + 4),
                         (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(pcVar1 + 6),(int *)&local_1c), bVar2)) &&
     (pcVar1 = (date->_M_dataplus)._M_p,
     bVar2 = util::parse_number<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                       ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )(pcVar1 + 6),
                        (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )(pcVar1 + 8),&local_20), bVar2)) {
    local_14 = (year_month_day)((local_1c & 0xff) << 0x10 | local_18 & 0xffff | local_20 << 0x18);
    dVar3 = ::date::year_month_day::operator_cast_to_time_point(&local_14);
    (dp->__d).__r = (rep)dVar3;
    bVar2 = ::date::year_month_day::ok(&local_14);
    return bVar2;
  }
  return false;
}

Assistant:

bool parse_date(const std::string & date, day_point & dp)
{
    int y = 0, m = 0, d = 0;
    if(BOOST_UNLIKELY(
                !util::parse_number(date.begin(), date.begin() + 4, y) ||
                !util::parse_number(date.begin() + 4, date.begin() + 6, m) ||
                !util::parse_number(date.begin() + 6, date.begin() + 8, d)))
    {
        return false;
    }
    auto ymd = year(y)/m/d;
    dp = ymd;
    return ymd.ok();
}